

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDup(Abc_Ntk_t *pNtk)

{
  undefined8 *puVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  Abc_Ntk_t *pAVar7;
  size_t sVar8;
  char *__dest;
  char *pcVar9;
  long lVar10;
  long lVar11;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtkNew = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    pVVar6 = pNtk->vObjs;
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          puVar1 = (undefined8 *)pVVar6->pArray[lVar11];
          if (puVar1 != (undefined8 *)0x0) {
            if (((ulong)puVar1 & 1) != 0) goto LAB_00816084;
            if (*(int *)*puVar1 != 3) goto LAB_0081607b;
            if (*(int *)((long)puVar1 + 0x1c) == 2) {
              lVar10 = *(long *)(*(long *)((int *)*puVar1 + 8) + 8);
              pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 10 & 1) ^
                                  *(ulong *)(*(long *)(lVar10 + (long)*(int *)puVar1[4] * 8) + 0x40)
                                  ),(Abc_Obj_t *)
                                    ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 0xb & 1) ^
                                    *(ulong *)(*(long *)(lVar10 + (long)((int *)puVar1[4])[1] * 8) +
                                              0x40)));
              puVar1[8] = pAVar5;
            }
          }
          lVar11 = lVar11 + 1;
          pVVar6 = pNtk->vObjs;
        } while (lVar11 < pVVar6->nSize);
      }
      pVVar6 = pNtk->vObjs;
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          puVar1 = (undefined8 *)pVVar6->pArray[lVar11];
          if (puVar1 != (undefined8 *)0x0) {
            if (((ulong)puVar1 & 1) != 0) goto LAB_00816084;
            if (*(int *)*puVar1 != 3) goto LAB_0081607b;
            if ((*(int *)((long)puVar1 + 0x1c) == 2) && (puVar1[7] != 0)) {
              *(undefined8 *)(puVar1[8] + 0x38) = *(undefined8 *)(puVar1[7] + 0x40);
            }
          }
          lVar11 = lVar11 + 1;
          pVVar6 = pNtk->vObjs;
        } while (lVar11 < pVVar6->nSize);
      }
      pVVar6 = pNtk->vCos;
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          plVar2 = (long *)pVVar6->pArray[lVar11];
          Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                              (long)*(int *)plVar2[4] * 8) + 0x40)));
          lVar11 = lVar11 + 1;
          pVVar6 = pNtk->vCos;
        } while (lVar11 < pVVar6->nSize);
      }
      if (pNtk->nObjCounts[7] != pNtkNew->nObjCounts[7]) {
        printf(
              "Warning: Structural hashing during duplication reduced %d nodes (this is a minor bug).\n"
              );
      }
    }
    else {
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          pAVar5 = (Abc_Obj_t *)pVVar6->pArray[lVar11];
          if ((pAVar5 != (Abc_Obj_t *)0x0) && ((pAVar5->field_6).pTemp == (void *)0x0)) {
            uVar3 = 0;
            if (pNtk->ntkFunc == ABC_FUNC_BLACKBOX) {
              uVar3 = (uint)((*(uint *)&pAVar5->field_0x14 & 0xf) == 6);
            }
            Abc_NtkDupObj(pNtkNew,pAVar5,uVar3);
          }
          lVar11 = lVar11 + 1;
          pVVar6 = pNtk->vObjs;
        } while (lVar11 < pVVar6->nSize);
      }
      pVVar6 = pNtk->vObjs;
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          plVar2 = (long *)pVVar6->pArray[lVar11];
          if ((((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xe) != 8)) &&
              (uVar3 = *(uint *)((long)plVar2 + 0x14) & 0xf, uVar3 != 5)) &&
             ((uVar3 != 10 && (0 < *(int *)((long)plVar2 + 0x1c))))) {
            lVar10 = 0;
            do {
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)(plVar2[4] + lVar10 * 4) * 8) + 0x40));
              lVar10 = lVar10 + 1;
            } while (lVar10 < *(int *)((long)plVar2 + 0x1c));
          }
          lVar11 = lVar11 + 1;
          pVVar6 = pNtk->vObjs;
        } while (lVar11 < pVVar6->nSize);
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar7 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar7;
    }
    if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
      pAVar7 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtkNew->pExcare = pAVar7;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtkNew,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtkNew,pNtk);
    }
    pcVar9 = pNtk->pWLoadUsed;
    if (pcVar9 != (char *)0x0) {
      sVar8 = strlen(pcVar9);
      __dest = (char *)malloc(sVar8 + 1);
      strcpy(__dest,pcVar9);
      pNtkNew->pWLoadUsed = __dest;
    }
    iVar4 = Abc_NtkCheck(pNtkNew);
    if (iVar4 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtkNew;
  }
  return pNtkNew;
LAB_00816084:
  pcVar9 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_0081608b;
LAB_0081607b:
  pcVar9 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_0081608b:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDup( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    if ( Abc_NtkIsStrash(pNtk) )
    {
        // copy the AND gates
        Abc_AigForEachAnd( pNtk, pObj, i )
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        // relink the choice nodes
        Abc_AigForEachAnd( pNtk, pObj, i )
            if ( pObj->pData )
                pObj->pCopy->pData = ((Abc_Obj_t *)pObj->pData)->pCopy;
        // relink the CO nodes
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
        // get the number of nodes before and after
        if ( Abc_NtkNodeNum(pNtk) != Abc_NtkNodeNum(pNtkNew) )
            printf( "Warning: Structural hashing during duplication reduced %d nodes (this is a minor bug).\n",
                Abc_NtkNodeNum(pNtk) - Abc_NtkNodeNum(pNtkNew) );
    }
    else
    {
        // duplicate the nets and nodes (CIs/COs/latches already dupped)
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( pObj->pCopy == NULL )
                Abc_NtkDupObj(pNtkNew, pObj, Abc_NtkHasBlackbox(pNtk) && Abc_ObjIsNet(pObj));
        // reconnect all objects (no need to transfer attributes on edges)
        Abc_NtkForEachObj( pNtk, pObj, i )
            if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}